

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
preciseUnitOps_rootMeter_Test::preciseUnitOps_rootMeter_Test(preciseUnitOps_rootMeter_Test *this)

{
  preciseUnitOps_rootMeter_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__preciseUnitOps_rootMeter_Test_0025c6e0;
  return;
}

Assistant:

TEST(preciseUnitOps, rootMeter)
{
    auto m1 = precise::m.pow(1);
    EXPECT_EQ(precise::m, root(m1, 1));
    EXPECT_EQ(precise::m.inv(), root(m1, -1));
    auto m2 = pow(precise::m, 2);  // use the alternate free function form
    EXPECT_EQ(precise::m, root(m2, 2));
    EXPECT_EQ(precise::m, sqrt(m2));
    auto m4 = precise::m.pow(4);
    EXPECT_EQ(precise::m * precise::m, root(m4, 2));
    EXPECT_EQ(precise::m, root(m4, 4));
}